

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_superres_scale(AV1_COMMON *cm,aom_write_bit_buffer *wb)

{
  aom_write_bit_buffer *in_RSI;
  long in_RDI;
  SequenceHeader *seq_params;
  long lVar1;
  
  lVar1 = *(long *)(in_RDI + 0x6088);
  if (*(char *)(lVar1 + 0x42) != '\0') {
    if (*(char *)(in_RDI + 0x50) == '\b') {
      aom_wb_write_bit(in_RSI,0);
    }
    else {
      aom_wb_write_bit(in_RSI,1);
      aom_wb_write_literal(in_RSI,(int)((ulong)lVar1 >> 0x20),(int)lVar1);
    }
  }
  return;
}

Assistant:

static inline void write_superres_scale(const AV1_COMMON *const cm,
                                        struct aom_write_bit_buffer *wb) {
  const SequenceHeader *const seq_params = cm->seq_params;
  if (!seq_params->enable_superres) {
    assert(cm->superres_scale_denominator == SCALE_NUMERATOR);
    return;
  }

  // First bit is whether to to scale or not
  if (cm->superres_scale_denominator == SCALE_NUMERATOR) {
    aom_wb_write_bit(wb, 0);  // no scaling
  } else {
    aom_wb_write_bit(wb, 1);  // scaling, write scale factor
    assert(cm->superres_scale_denominator >= SUPERRES_SCALE_DENOMINATOR_MIN);
    assert(cm->superres_scale_denominator <
           SUPERRES_SCALE_DENOMINATOR_MIN + (1 << SUPERRES_SCALE_BITS));
    aom_wb_write_literal(
        wb, cm->superres_scale_denominator - SUPERRES_SCALE_DENOMINATOR_MIN,
        SUPERRES_SCALE_BITS);
  }
}